

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

void __thiscall
kj::MainBuilder::MainBuilder
          (MainBuilder *this,ProcessContext *context,StringPtr version,StringPtr briefDescription,
          StringPtr extendedDescription)

{
  Impl *pIVar1;
  Iface *pIVar2;
  Function<kj::MainBuilder::Validity_()> *pFVar3;
  Option *pOVar4;
  Arena *pAVar5;
  Iface *ptrCopy;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr helpText;
  StringPtr helpText_00;
  OptionName local_50;
  StringPtr local_40;
  StringPtr local_30;
  
  local_40.content.size_ = briefDescription.content.size_;
  local_40.content.ptr = briefDescription.content.ptr;
  local_30.content.size_ = version.content.size_;
  local_30.content.ptr = version.content.ptr;
  heap<kj::MainBuilder::Impl,kj::ProcessContext&,kj::StringPtr&,kj::StringPtr&,kj::StringPtr&>
            ((kj *)this,context,&local_30,&local_40,&extendedDescription);
  local_50.isLong = true;
  local_50.field_1.longName = "verbose";
  pIVar1 = (this->impl).ptr;
  pIVar2 = (Iface *)operator_new(0x18);
  pIVar2->_vptr_Iface = (_func_int **)&PTR_operator___0026e6a0;
  pIVar2[1]._vptr_Iface = (_func_int **)pIVar1;
  pAVar5 = &pIVar1->arena;
  pFVar3 = (Function<kj::MainBuilder::Validity_()> *)Arena::allocateBytes(pAVar5,0x10,8,true);
  (pFVar3->impl).disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_0,kj::MainBuilder::$_0(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_1>>>
        ::instance;
  (pFVar3->impl).ptr = pIVar2;
  Arena::setDestructor
            (pAVar5,pFVar3,Arena::destroyObject<kj::Function<kj::MainBuilder::Validity()>>);
  names._M_len = 1;
  names._M_array = &local_50;
  helpText.content.size_ = 0x3c;
  helpText.content.ptr = "Log informational messages to stderr; useful for debugging.";
  pOVar4 = Impl::addOption((this->impl).ptr,names,false,helpText);
  (pOVar4->field_2).func = pFVar3;
  local_50.isLong = true;
  local_50.field_1.longName = "version";
  pIVar1 = (this->impl).ptr;
  pIVar2 = (Iface *)operator_new(0x18);
  pIVar2->_vptr_Iface = (_func_int **)&PTR_operator___0026e708;
  pIVar2[1]._vptr_Iface = (_func_int **)pIVar1;
  pAVar5 = &pIVar1->arena;
  pFVar3 = (Function<kj::MainBuilder::Validity_()> *)Arena::allocateBytes(pAVar5,0x10,8,true);
  (pFVar3->impl).disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_2,kj::MainBuilder::$_2(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::$_3>>>
        ::instance;
  (pFVar3->impl).ptr = pIVar2;
  Arena::setDestructor
            (pAVar5,pFVar3,Arena::destroyObject<kj::Function<kj::MainBuilder::Validity()>>);
  names_00._M_len = 1;
  names_00._M_array = &local_50;
  helpText_00.content.size_ = 0x24;
  helpText_00.content.ptr = "Print version information and exit.";
  pOVar4 = Impl::addOption((this->impl).ptr,names_00,false,helpText_00);
  (pOVar4->field_2).func = pFVar3;
  return;
}

Assistant:

MainBuilder::MainBuilder(ProcessContext& context, StringPtr version,
                         StringPtr briefDescription, StringPtr extendedDescription)
    : impl(heap<Impl>(context, version, briefDescription, extendedDescription)) {
  addOption({"verbose"}, KJ_BIND_METHOD(*impl, increaseVerbosity),
            "Log informational messages to stderr; useful for debugging.");
  addOption({"version"}, KJ_BIND_METHOD(*impl, printVersion),
            "Print version information and exit.");
}